

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

MemChunk * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::removeSmallChunkList
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,BinIndexType binIndex
          )

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  iVar2 = CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
          ::remove(this->m_smallLists + binIndex,(char *)CONCAT44(in_register_00000034,binIndex));
  if (this->m_smallLists[binIndex].m_head == (SmallMemChunk *)0x0) {
    bVar1 = (byte)binIndex & 0x1f;
    this->m_smallMap = this->m_smallMap & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  }
  return (MemChunk *)CONCAT44(extraout_var,iVar2);
}

Assistant:

inline MemChunk*
    removeSmallChunkList (BinIndexType binIndex)
    {
        CircularList<SmallMemChunk>& freeList = getSmallChunkList (binIndex);
        SmallMemChunk* chunk = freeList.remove();
        if (freeList.isEmpty ())
        {
            clearSmallMap (binIndex);
        }
        return chunk;
    }